

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

void htmlNodeDumpFormatOutput
               (xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlElementType xVar1;
  xmlAttrPtr cur_00;
  xmlNodePtr pxVar2;
  xmlNodePtr pxVar3;
  int iVar4;
  xmlNodePtr cur_01;
  htmlElemDesc *phVar5;
  char *str;
  xmlChar *pxVar6;
  _xmlNode *p_Var7;
  
  xmlInitParser();
  if (buf == (xmlOutputBufferPtr)0x0 || cur == (xmlNodePtr)0x0) {
    return;
  }
  pxVar3 = cur;
  cur_01 = cur->parent;
LAB_0016f828:
  p_Var7 = cur_01;
  cur_01 = pxVar3;
  switch(cur_01->type) {
  case XML_ELEMENT_NODE:
    if ((cur_01->parent != p_Var7) && (cur_01->children != (_xmlNode *)0x0)) {
      htmlNodeDumpFormatOutput(buf,doc,cur_01,encoding,format);
      goto switchD_0016f84a_caseD_6;
    }
    if (cur_01->ns == (xmlNs *)0x0) {
      phVar5 = htmlTagLookup(cur_01->name);
    }
    else {
      phVar5 = (htmlElemDesc *)0x0;
    }
    xmlOutputBufferWriteString(buf,"<");
    if ((cur_01->ns != (xmlNs *)0x0) && (pxVar6 = cur_01->ns->prefix, pxVar6 != (xmlChar *)0x0)) {
      xmlOutputBufferWriteString(buf,(char *)pxVar6);
      xmlOutputBufferWriteString(buf,":");
    }
    xmlOutputBufferWriteString(buf,(char *)cur_01->name);
    if (cur_01->nsDef != (xmlNsPtr)0x0) {
      xmlNsListDumpOutput(buf,cur_01->nsDef);
    }
    for (cur_00 = cur_01->properties; cur_00 != (xmlAttrPtr)0x0; cur_00 = cur_00->next) {
      htmlAttrDumpOutput(buf,doc,cur_00);
    }
    if ((phVar5 == (htmlElemDesc *)0x0) || (phVar5->empty == '\0')) {
      if (cur_01->children != (_xmlNode *)0x0) {
        xmlOutputBufferWriteString(buf,">");
        if (((format != 0) && (phVar5 != (htmlElemDesc *)0x0)) && (phVar5->isinline == '\0')) {
          xVar1 = cur_01->children->type;
          if (((xVar1 != XML_TEXT_NODE) && (xVar1 != XML_ENTITY_REF_NODE)) &&
             ((cur_01->children != cur_01->last &&
              ((cur_01->name != (xmlChar *)0x0 && (*cur_01->name != 'p')))))) {
            xmlOutputBufferWriteString(buf,"\n");
          }
        }
        pxVar3 = cur_01->children;
        goto LAB_0016f828;
      }
      if ((((phVar5 == (htmlElemDesc *)0x0) || (phVar5->saveEndTag == '\0')) ||
          (iVar4 = xmlStrcmp((xmlChar *)phVar5->name,"html"), iVar4 == 0)) ||
         (iVar4 = xmlStrcmp((xmlChar *)phVar5->name,"body"), iVar4 == 0)) {
        xmlOutputBufferWriteString(buf,"></");
        if ((cur_01->ns != (xmlNs *)0x0) && (pxVar6 = cur_01->ns->prefix, pxVar6 != (xmlChar *)0x0))
        {
          xmlOutputBufferWriteString(buf,(char *)pxVar6);
          xmlOutputBufferWriteString(buf,":");
        }
        xmlOutputBufferWriteString(buf,(char *)cur_01->name);
      }
    }
    xmlOutputBufferWriteString(buf,">");
    if (((format == 0) || (cur_01->next == (_xmlNode *)0x0 || phVar5 == (htmlElemDesc *)0x0)) ||
       ((phVar5->isinline != '\0' ||
        ((((xVar1 = cur_01->next->type, xVar1 == XML_TEXT_NODE ||
           (p_Var7 == (xmlNodePtr)0x0 || xVar1 == XML_ENTITY_REF_NODE)) ||
          (p_Var7->name == (xmlChar *)0x0)) || (*p_Var7->name == 'p'))))))
    goto switchD_0016f84a_caseD_6;
    pxVar6 = "\n";
    break;
  case XML_ATTRIBUTE_NODE:
    htmlAttrDumpOutput(buf,doc,(xmlAttrPtr)cur_01);
    goto switchD_0016f84a_caseD_6;
  case XML_TEXT_NODE:
    if (cur_01->content == (xmlChar *)0x0) goto switchD_0016f84a_caseD_6;
    if ((cur_01->name != "textnoenc") &&
       ((p_Var7 == (xmlNodePtr)0x0 ||
        ((iVar4 = xmlStrcasecmp(p_Var7->name,"script"), iVar4 != 0 &&
         (iVar4 = xmlStrcasecmp(p_Var7->name,"style"), iVar4 != 0)))))) {
      pxVar6 = xmlEncodeEntitiesReentrant(doc,cur_01->content);
      if (pxVar6 == (xmlChar *)0x0) {
        buf->error = 2;
        return;
      }
      xmlOutputBufferWriteString(buf,(char *)pxVar6);
      (*xmlFree)(pxVar6);
      goto switchD_0016f84a_caseD_6;
    }
    pxVar6 = cur_01->content;
    break;
  case XML_CDATA_SECTION_NODE:
    pxVar6 = cur_01->content;
    if (pxVar6 == (xmlChar *)0x0) goto switchD_0016f84a_caseD_6;
    break;
  case XML_ENTITY_REF_NODE:
    xmlOutputBufferWriteString(buf,"&");
    xmlOutputBufferWriteString(buf,(char *)cur_01->name);
    pxVar6 = ";";
    break;
  default:
    goto switchD_0016f84a_caseD_6;
  case XML_PI_NODE:
    if (cur_01->name == (xmlChar *)0x0) goto switchD_0016f84a_caseD_6;
    xmlOutputBufferWriteString(buf,"<?");
    xmlOutputBufferWriteString(buf,(char *)cur_01->name);
    if (cur_01->content != (xmlChar *)0x0) {
      xmlOutputBufferWriteString(buf," ");
      xmlOutputBufferWriteString(buf,(char *)cur_01->content);
    }
    pxVar6 = ">";
    break;
  case XML_COMMENT_NODE:
    if (cur_01->content == (xmlChar *)0x0) goto switchD_0016f84a_caseD_6;
    xmlOutputBufferWriteString(buf,"<!--");
    xmlOutputBufferWriteString(buf,(char *)cur_01->content);
    pxVar6 = "-->";
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar6 = cur_01->content;
    if (pxVar6 != (xmlChar *)0x0) {
      xmlOutputBufferWriteString(buf,"<!DOCTYPE ");
      xmlOutputBufferWriteString(buf,*(char **)(pxVar6 + 0x10));
      if (*(long *)(pxVar6 + 0x68) == 0) {
        if ((*(xmlChar **)(pxVar6 + 0x70) != (xmlChar *)0x0) &&
           (iVar4 = xmlStrcmp(*(xmlChar **)(pxVar6 + 0x70),(xmlChar *)"about:legacy-compat"),
           iVar4 != 0)) {
          str = " SYSTEM ";
          goto LAB_0016fbb8;
        }
      }
      else {
        xmlOutputBufferWriteString(buf," PUBLIC ");
        xmlOutputBufferWriteQuotedString(buf,*(xmlChar **)(pxVar6 + 0x68));
        if (*(long *)(pxVar6 + 0x70) != 0) {
          str = " ";
LAB_0016fbb8:
          xmlOutputBufferWriteString(buf,str);
          xmlOutputBufferWriteQuotedString(buf,*(xmlChar **)(pxVar6 + 0x70));
        }
      }
      xmlOutputBufferWriteString(buf,">\n");
    }
    if (cur_01->children == (_xmlNode *)0x0) {
      xmlOutputBufferWriteString(buf,"\n");
      goto switchD_0016f84a_caseD_6;
    }
    pxVar3 = cur_01->children;
    if (cur_01->parent != p_Var7) {
switchD_0016f84a_caseD_6:
      pxVar2 = cur_01;
joined_r0x0016f9f3:
      cur_01 = p_Var7;
      if (pxVar2 == cur) {
        return;
      }
      pxVar3 = pxVar2->next;
      if (pxVar2->next == (_xmlNode *)0x0) {
        p_Var7 = cur_01->parent;
        pxVar2 = cur_01;
        if ((cur_01->type | XML_CDATA_SECTION_NODE) != XML_HTML_DOCUMENT_NODE) goto LAB_0016fa37;
        goto LAB_0016fa1b;
      }
    }
    goto LAB_0016f828;
  }
  xmlOutputBufferWriteString(buf,(char *)pxVar6);
  goto switchD_0016f84a_caseD_6;
LAB_0016fa37:
  if ((format == 0) || (cur_01->ns != (xmlNs *)0x0)) {
    phVar5 = (htmlElemDesc *)0x0;
  }
  else {
    phVar5 = htmlTagLookup(cur_01->name);
  }
  if ((phVar5 != (htmlElemDesc *)0x0 && format != 0) && (phVar5->isinline == '\0')) {
    xVar1 = cur_01->last->type;
    if (((xVar1 != XML_TEXT_NODE) &&
        (((xVar1 != XML_ENTITY_REF_NODE && (cur_01->children != cur_01->last)) &&
         (cur_01->name != (xmlChar *)0x0)))) && (*cur_01->name != 'p')) {
      xmlOutputBufferWriteString(buf,"\n");
    }
  }
  xmlOutputBufferWriteString(buf,"</");
  if ((cur_01->ns != (xmlNs *)0x0) && (pxVar6 = cur_01->ns->prefix, pxVar6 != (xmlChar *)0x0)) {
    xmlOutputBufferWriteString(buf,(char *)pxVar6);
    xmlOutputBufferWriteString(buf,":");
  }
  xmlOutputBufferWriteString(buf,(char *)cur_01->name);
  xmlOutputBufferWriteString(buf,">");
  if ((((phVar5 != (htmlElemDesc *)0x0 && format != 0) && (phVar5->isinline == '\0')) &&
      ((cur_01->next != (_xmlNode *)0x0 &&
       (((xVar1 = cur_01->next->type, xVar1 != XML_TEXT_NODE &&
         (p_Var7 != (_xmlNode *)0x0 && xVar1 != XML_ENTITY_REF_NODE)) &&
        (p_Var7->name != (xmlChar *)0x0)))))) && (*p_Var7->name != 'p')) {
LAB_0016fa1b:
    xmlOutputBufferWriteString(buf,"\n");
  }
  goto joined_r0x0016f9f3;
}

Assistant:

void
htmlNodeDumpFormatOutput(xmlOutputBufferPtr buf, xmlDocPtr doc,
	                 xmlNodePtr cur, const char *encoding ATTRIBUTE_UNUSED,
                         int format) {
    xmlNodePtr root, parent;
    xmlAttrPtr attr;
    const htmlElemDesc * info;

    xmlInitParser();

    if ((cur == NULL) || (buf == NULL)) {
	return;
    }

    root = cur;
    parent = cur->parent;
    while (1) {
        switch (cur->type) {
        case XML_HTML_DOCUMENT_NODE:
        case XML_DOCUMENT_NODE:
            if (((xmlDocPtr) cur)->intSubset != NULL) {
                htmlDtdDumpOutput(buf, (xmlDocPtr) cur, NULL);
            }
            if (cur->children != NULL) {
                /* Always validate cur->parent when descending. */
                if (cur->parent == parent) {
                    parent = cur;
                    cur = cur->children;
                    continue;
                }
            } else {
                xmlOutputBufferWriteString(buf, "\n");
            }
            break;

        case XML_ELEMENT_NODE:
            /*
             * Some users like lxml are known to pass nodes with a corrupted
             * tree structure. Fall back to a recursive call to handle this
             * case.
             */
            if ((cur->parent != parent) && (cur->children != NULL)) {
                htmlNodeDumpFormatOutput(buf, doc, cur, encoding, format);
                break;
            }

            /*
             * Get specific HTML info for that node.
             */
            if (cur->ns == NULL)
                info = htmlTagLookup(cur->name);
            else
                info = NULL;

            xmlOutputBufferWriteString(buf, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWriteString(buf, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutput(buf, cur->nsDef);
            attr = cur->properties;
            while (attr != NULL) {
                htmlAttrDumpOutput(buf, doc, attr);
                attr = attr->next;
            }

            if ((info != NULL) && (info->empty)) {
                xmlOutputBufferWriteString(buf, ">");
            } else if (cur->children == NULL) {
                if ((info != NULL) && (info->saveEndTag != 0) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "html")) &&
                    (xmlStrcmp(BAD_CAST info->name, BAD_CAST "body"))) {
                    xmlOutputBufferWriteString(buf, ">");
                } else {
                    xmlOutputBufferWriteString(buf, "></");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWriteString(buf, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWriteString(buf, ">");
                }
            } else {
                xmlOutputBufferWriteString(buf, ">");
                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->children->type != HTML_TEXT_NODE) &&
                    (cur->children->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
                parent = cur;
                cur = cur->children;
                continue;
            }

            if ((format) && (cur->next != NULL) &&
                (info != NULL) && (!info->isinline)) {
                if ((cur->next->type != HTML_TEXT_NODE) &&
                    (cur->next->type != HTML_ENTITY_REF_NODE) &&
                    (parent != NULL) &&
                    (parent->name != NULL) &&
                    (parent->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");
            }

            break;

        case XML_ATTRIBUTE_NODE:
            htmlAttrDumpOutput(buf, doc, (xmlAttrPtr) cur);
            break;

        case HTML_TEXT_NODE:
            if (cur->content == NULL)
                break;
            if (((cur->name == (const xmlChar *)xmlStringText) ||
                 (cur->name != (const xmlChar *)xmlStringTextNoenc)) &&
                ((parent == NULL) ||
                 ((xmlStrcasecmp(parent->name, BAD_CAST "script")) &&
                  (xmlStrcasecmp(parent->name, BAD_CAST "style"))))) {
                xmlChar *buffer;

                buffer = xmlEncodeEntitiesReentrant(doc, cur->content);
                if (buffer == NULL) {
                    buf->error = XML_ERR_NO_MEMORY;
                    return;
                }
                xmlOutputBufferWriteString(buf, (const char *)buffer);
                xmlFree(buffer);
            } else {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        case HTML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWriteString(buf, "-->");
            }
            break;

        case HTML_PI_NODE:
            if (cur->name != NULL) {
                xmlOutputBufferWriteString(buf, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWriteString(buf, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWriteString(buf, ">");
            }
            break;

        case HTML_ENTITY_REF_NODE:
            xmlOutputBufferWriteString(buf, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWriteString(buf, ";");
            break;

        case HTML_PRESERVE_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
            }
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            cur = parent;
            /* cur->parent was validated when descending. */
            parent = cur->parent;

            if ((cur->type == XML_HTML_DOCUMENT_NODE) ||
                (cur->type == XML_DOCUMENT_NODE)) {
                xmlOutputBufferWriteString(buf, "\n");
            } else {
                if ((format) && (cur->ns == NULL))
                    info = htmlTagLookup(cur->name);
                else
                    info = NULL;

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->last->type != HTML_TEXT_NODE) &&
                    (cur->last->type != HTML_ENTITY_REF_NODE) &&
                    (cur->children != cur->last) &&
                    (cur->name != NULL) &&
                    (cur->name[0] != 'p')) /* p, pre, param */
                    xmlOutputBufferWriteString(buf, "\n");

                xmlOutputBufferWriteString(buf, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(buf, ":");
                }
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWriteString(buf, ">");

                if ((format) && (info != NULL) && (!info->isinline) &&
                    (cur->next != NULL)) {
                    if ((cur->next->type != HTML_TEXT_NODE) &&
                        (cur->next->type != HTML_ENTITY_REF_NODE) &&
                        (parent != NULL) &&
                        (parent->name != NULL) &&
                        (parent->name[0] != 'p')) /* p, pre, param */
                        xmlOutputBufferWriteString(buf, "\n");
                }
            }
        }
    }
}